

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringCacheAllocator_allocationIsCached_Test::
TEST_SimpleStringCacheAllocator_allocationIsCached_Test
          (TEST_SimpleStringCacheAllocator_allocationIsCached_Test *this)

{
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).accountant.useCacheSizes_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).accountingAllocator =
       (AccountingTestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).accountant.head_ =
       (MemoryAccountantAllocationNode *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).accountant.allocator_ =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).cache.nonCachedAllocations_ =
       (SimpleStringMemoryBlock *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).cache.
    hasWarnedAboutDeallocations = 0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).cache.allocator_ =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).cache.cache_ =
       (SimpleStringInternalCacheNode *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).allocator =
       (SimpleStringCacheAllocator *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator_003721b8;
  SimpleStringInternalCache::SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).cache);
  MemoryAccountant::MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).accountant);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringCacheAllocator_00370810;
  return;
}

Assistant:

TEST(SimpleStringCacheAllocator, allocationIsCached)
{
    char* mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    size_t totalAllocations = accountant.totalAllocations();
    size_t totalDeallocations = accountant.totalDeallocations();

    mem = allocator->alloc_memory(10, __FILE__, __LINE__);
    allocator->free_memory(mem, 10,  __FILE__, __LINE__);

    LONGS_EQUAL(totalAllocations, accountant.totalAllocations());
    LONGS_EQUAL(totalDeallocations, accountant.totalDeallocations());
}